

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Transform *
phyr::Transform::perspective(Transform *__return_storage_ptr__,double fov,double near,double far)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  int i;
  long lVar11;
  long lVar12;
  Mat4x4 *pMVar13;
  Transform *pTVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  Mat4x4 _m_1;
  Mat4x4 _m;
  double adStack_400 [10];
  undefined8 uStack_3b0;
  double local_3a0 [22];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  double local_2a0 [16];
  Mat4x4 local_220;
  double local_1a0 [32];
  undefined1 local_a0 [96];
  double local_40;
  double dStack_38;
  double local_30;
  double dStack_28;
  
  bVar15 = 0;
  local_a0._0_8_ = 1.0;
  local_a0._8_8_ = 0.0;
  local_a0._16_8_ = 0.0;
  local_a0._24_8_ = 0.0;
  local_a0._32_8_ = 0.0;
  local_a0._40_8_ = 1.0;
  local_a0._48_8_ = 0.0;
  local_a0._56_8_ = 0.0;
  local_a0._64_8_ = 0.0;
  local_a0._72_8_ = 0.0;
  auVar16._8_8_ = -far * near;
  auVar16._0_8_ = far;
  auVar5._8_8_ = far - near;
  auVar5._0_8_ = far - near;
  local_a0._80_16_ = divpd(auVar16,auVar5);
  local_40 = 0.0;
  dStack_38 = 0.0;
  local_30 = 1.0;
  dStack_28 = 0.0;
  uStack_3b0 = 0x105cf2;
  local_3a0[0] = tan(fov * 0.017453292519943295 * 0.5);
  local_3a0[0] = 1.0 / local_3a0[0];
  local_3a0[1] = 0.0;
  local_3a0[2] = 0.0;
  local_3a0[3] = 0.0;
  local_3a0[4] = 0.0;
  local_3a0[5] = local_3a0[0];
  local_3a0[6] = 0.0;
  local_3a0[7] = 0.0;
  local_3a0[8] = 0.0;
  local_3a0[9] = 0.0;
  local_3a0[10] = 1.0;
  local_3a0[0xb] = 0.0;
  local_3a0[0xc] = 0.0;
  local_3a0[0xd] = 0.0;
  local_3a0[0xe] = 0.0;
  local_3a0[0xf] = 1.0;
  local_3a0[0x10] = 1.0 / local_3a0[0];
  local_3a0[0x11] = 0.0;
  local_3a0[0x12] = 0.0;
  local_3a0[0x13] = 0.0;
  local_3a0[0x14] = 0.0;
  local_3a0[0x15] = 1.0 / local_3a0[0];
  local_2f0 = 0;
  uStack_2e8 = 0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2d0 = 0x3ff0000000000000;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 0x3ff0000000000000;
  pMVar13 = (Mat4x4 *)local_a0;
  pdVar10 = local_2a0;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    *pdVar10 = pMVar13->d[0][0];
    pMVar13 = (Mat4x4 *)((long)pMVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    pdVar10 = pdVar10 + (ulong)bVar15 * -2 + 1;
  }
  uStack_3b0 = 0x105dc5;
  _Mat4x4::inverse(&local_220,(Mat4x4 *)local_a0);
  pdVar10 = local_1a0 + 0x10;
  local_1a0[0x1f] = 1.0;
  local_1a0[0x1a] = 1.0;
  local_1a0[0x15] = 1.0;
  local_1a0[0x10] = 1.0;
  local_1a0[0x11] = 0.0;
  local_1a0[0x12] = 0.0;
  local_1a0[0x13] = 0.0;
  local_1a0[0x14] = 0.0;
  local_1a0[0x16] = 0.0;
  local_1a0[0x17] = 0.0;
  local_1a0[0x18] = 0.0;
  local_1a0[0x19] = 0.0;
  local_1a0[0x1b] = 0.0;
  local_1a0[0x1c] = 0.0;
  local_1a0[0x1d] = 0.0;
  local_1a0[0x1e] = 0.0;
  lVar11 = 0;
  do {
    dVar1 = adStack_400[lVar11 * 4 + 0xc];
    dVar2 = adStack_400[lVar11 * 4 + 0xd];
    dVar3 = adStack_400[lVar11 * 4 + 0xe];
    dVar4 = adStack_400[lVar11 * 4 + 0xf];
    lVar12 = 0;
    do {
      dVar6 = local_2a0[lVar12 + 1];
      dVar7 = local_2a0[lVar12 + 5];
      dVar8 = local_2a0[lVar12 + 9];
      dVar9 = local_2a0[lVar12 + 0xd];
      pdVar10[lVar12] =
           local_2a0[lVar12 + 0xc] * dVar4 +
           local_2a0[lVar12 + 8] * dVar3 + local_2a0[lVar12 + 4] * dVar2 + local_2a0[lVar12] * dVar1
      ;
      (pdVar10 + lVar12)[1] = dVar9 * dVar4 + dVar8 * dVar3 + dVar7 * dVar2 + dVar6 * dVar1;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 4);
    lVar11 = lVar11 + 1;
    pdVar10 = pdVar10 + 4;
  } while (lVar11 != 4);
  pdVar10 = local_1a0;
  local_1a0[0xf] = 1.0;
  local_1a0[10] = 1.0;
  local_1a0[5] = 1.0;
  local_1a0[0] = 1.0;
  local_1a0[1] = 0.0;
  local_1a0[2] = 0.0;
  local_1a0[3] = 0.0;
  local_1a0[4] = 0.0;
  local_1a0[6] = 0.0;
  local_1a0[7] = 0.0;
  local_1a0[8] = 0.0;
  local_1a0[9] = 0.0;
  local_1a0[0xb] = 0.0;
  local_1a0[0xc] = 0.0;
  local_1a0[0xd] = 0.0;
  local_1a0[0xe] = 0.0;
  lVar11 = 0;
  do {
    dVar1 = local_220.d[lVar11][0];
    dVar2 = local_220.d[lVar11][1];
    dVar3 = local_220.d[lVar11][2];
    dVar4 = local_220.d[lVar11][3];
    lVar12 = 0x1c;
    do {
      dVar6 = adStack_400[lVar12 + 1];
      dVar7 = adStack_400[lVar12 + 5];
      dVar8 = adStack_400[lVar12 + 9];
      dVar9 = adStack_400[lVar12 + 0xd];
      pdVar10[lVar12 + -0x1c] =
           adStack_400[lVar12 + 0xc] * dVar4 +
           adStack_400[lVar12 + 8] * dVar3 +
           adStack_400[lVar12 + 4] * dVar2 + adStack_400[lVar12] * dVar1;
      (pdVar10 + lVar12 + -0x1c)[1] = dVar9 * dVar4 + dVar8 * dVar3 + dVar7 * dVar2 + dVar6 * dVar1;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 0x20);
    lVar11 = lVar11 + 1;
    pdVar10 = pdVar10 + 4;
  } while (lVar11 != 4);
  pdVar10 = local_1a0 + 0x10;
  pTVar14 = __return_storage_ptr__;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pTVar14->mat).d[0][0] = *pdVar10;
    pdVar10 = pdVar10 + (ulong)bVar15 * -2 + 1;
    pTVar14 = (Transform *)((long)pTVar14 + (ulong)bVar15 * -0x10 + 8);
  }
  pdVar10 = local_1a0;
  pMVar13 = &__return_storage_ptr__->invMat;
  for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
    pMVar13->d[0][0] = *pdVar10;
    pdVar10 = pdVar10 + (ulong)bVar15 * -2 + 1;
    pMVar13 = (Mat4x4 *)((long)pMVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::perspective(Real fov, Real near, Real far) {
    // Matrix for projective divide
    Mat4x4 persMat(1, 0,                  0,                          0,
                   0, 1,                  0,                          0,
                   0, 0, far / (far - near), -far * near / (far - near),
                   0, 0,                  1,                          0);

    // Apply fov factor
    Real invTan = 1 / std::tan(radians(fov) / 2);
    return Transform::scale(invTan, invTan, 1) * Transform(persMat);
}